

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
yy::parser::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  value_type *this_00;
  value_type *this_01;
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  
  (this->super_basic_symbol<yy::parser::by_state>).super_by_state.state = s;
  *(undefined8 *)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<yy::parser::by_state>).value.field_0 + 0x18) = 0;
  (this->super_basic_symbol<yy::parser::by_state>).value.yytypeid_ = (type_info *)0x0;
  pfVar1 = (that->super_basic_symbol<yy::parser::by_kind>).location.begin.filename;
  cVar4 = (that->super_basic_symbol<yy::parser::by_kind>).location.begin.line;
  cVar5 = (that->super_basic_symbol<yy::parser::by_kind>).location.begin.column;
  cVar2 = (that->super_basic_symbol<yy::parser::by_kind>).location.end.line;
  cVar3 = (that->super_basic_symbol<yy::parser::by_kind>).location.end.column;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.filename =
       (that->super_basic_symbol<yy::parser::by_kind>).location.end.filename;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.line = cVar2;
  (this->super_basic_symbol<yy::parser::by_state>).location.end.column = cVar3;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.filename = pfVar1;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.line = cVar4;
  (this->super_basic_symbol<yy::parser::by_state>).location.begin.column = cVar5;
  uVar6 = (ulong)(uint)(that->super_basic_symbol<yy::parser::by_kind>).super_by_kind.kind_;
  if (uVar6 < 0x2c) {
    this_00 = &(this->super_basic_symbol<yy::parser::by_state>).value;
    if ((0xd61c0000000U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x70880UL >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0xe) {
          value_type::move<ReferenceType>
                    (this_00,&(that->super_basic_symbol<yy::parser::by_kind>).value);
        }
      }
      else {
        this_01 = &(that->super_basic_symbol<yy::parser::by_kind>).value;
        u = value_type::as<std::__cxx11::string>(this_01);
        value_type::emplace<std::__cxx11::string,std::__cxx11::string>(this_00,u);
        value_type::destroy<std::__cxx11::string>(this_01);
      }
    }
    else {
      value_type::move<unsigned_long>
                (this_00,&(that->super_basic_symbol<yy::parser::by_kind>).value);
    }
  }
  (that->super_basic_symbol<yy::parser::by_kind>).super_by_kind.kind_ = S_YYEMPTY;
  return;
}

Assistant:

parser::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.move< ReferenceType > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.move< std::size_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.move< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }